

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GotoLabel *goto_label)

{
  pointer pTVar1;
  Type TVar2;
  uint uVar3;
  Label *label;
  string *psVar4;
  pointer args;
  LabelName *u;
  LabelName *u_00;
  pointer pTVar5;
  int iVar6;
  pointer pTVar7;
  allocator<char> local_69;
  undefined8 local_68;
  Index IStack_60;
  GotoLabel *local_58;
  StackVar local_50 [2];
  
  local_58 = goto_label;
  label = FindLabel(this,goto_label->var,true);
  args = (label->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pTVar5 = (label->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (args != pTVar5) {
    pTVar7 = (pointer)((long)(this->type_stack_).
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->type_stack_).
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3);
    pTVar1 = (pointer)label->type_stack_size;
    if (pTVar7 < pTVar1) {
      __assert_fail("type_stack_.size() >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x497,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    pTVar5 = (pointer)((long)pTVar5 - (long)args >> 3);
    args = (pointer)((long)pTVar7 - (long)pTVar5);
    if (pTVar7 < pTVar5) {
      __assert_fail("type_stack_.size() >= amount",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x498,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    if (args < pTVar1) {
      __assert_fail("type_stack_.size() - amount >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x499,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    iVar6 = (int)pTVar7 - ((int)pTVar1 + (int)pTVar5);
    if (iVar6 != 0) {
      for (uVar3 = 0; (pointer)(ulong)uVar3 < pTVar5; uVar3 = uVar3 + 1) {
        local_68._0_4_ = ~uVar3 + (int)pTVar5;
        local_50[0].index = iVar6 + (Index)local_68;
        args = (pointer)(ulong)local_50[0].index;
        TVar2 = (label->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)(ulong)uVar3];
        local_50[0].type.enum_ = TVar2.enum_;
        local_50[0].type.type_index_ = TVar2.type_index_;
        local_68._4_4_ = Any;
        IStack_60 = 0;
        Write(this,local_50);
        WriteData(this," = ",3);
        Write(this,(StackVar *)&local_68);
        WriteData(this,"; ",2);
      }
    }
  }
  WriteUnwindTryCatchStack(this,label);
  if (local_58->var->type_ == Name) {
    psVar4 = Var::name_abi_cxx11_(local_58->var);
    local_50[0].index = (Index)psVar4;
    local_50[0].type.enum_ = (Enum)((ulong)psVar4 >> 0x20);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])local_50,u,(char (*) [2])args);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"$Bfunc",&local_69);
    local_68 = local_50;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])&local_68,u_00,(char (*) [2])args);
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void CWriter::Write(const GotoLabel& goto_label) {
  const Label* label = FindLabel(goto_label.var);
  if (label->HasValue()) {
    size_t amount = label->sig.size();
    assert(type_stack_.size() >= label->type_stack_size);
    assert(type_stack_.size() >= amount);
    assert(type_stack_.size() - amount >= label->type_stack_size);
    Index offset = type_stack_.size() - label->type_stack_size - amount;
    if (offset != 0) {
      for (Index i = 0; i < amount; ++i) {
        Write(StackVar(amount - i - 1 + offset, label->sig[i]), " = ",
              StackVar(amount - i - 1), "; ");
      }
    }
  }

  WriteUnwindTryCatchStack(label);

  if (goto_label.var.is_name()) {
    Write("goto ", LabelName(goto_label.var.name()), ";");
  } else {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    Write("goto ", LabelName(kImplicitFuncLabel), ";");
  }
}